

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# 7zArcIn.c
# Opt level: O2

SRes SzReadAndDecodePackedStreams
               (ILookInStream *inStream,CSzData *sd,CBuf *tempBufs,UInt32 numFoldersMax,
               UInt64 baseOffset,CSzAr *p,ISzAlloc *allocTemp)

{
  SRes SVar1;
  uint uVar2;
  int iVar3;
  ulong uVar4;
  CBuf *pCVar5;
  size_t *psVar6;
  UInt64 local_70;
  CSubStreamInfo ssi;
  
  SVar1 = SzReadStreamsInfo(p,sd,numFoldersMax,(CBuf *)0x0,0,&local_70,&ssi,allocTemp);
  if (SVar1 != 0) {
    return SVar1;
  }
  uVar2 = p->NumFolders;
  if (uVar2 != 0) {
    pCVar5 = tempBufs;
    for (uVar4 = 0; uVar4 < uVar2; uVar4 = uVar4 + 1) {
      Buf_Init(pCVar5);
      uVar2 = p->NumFolders;
      pCVar5 = pCVar5 + 1;
    }
    uVar4 = 0;
    pCVar5 = tempBufs;
    do {
      if (p->NumFolders <= uVar4) {
        psVar6 = &tempBufs->size;
        uVar4 = 0;
        while( true ) {
          if (p->NumFolders <= uVar4) {
            return 0;
          }
          SVar1 = LookInStream_SeekTo(inStream,baseOffset + local_70);
          if (SVar1 != 0) break;
          SVar1 = SzAr_DecodeFolder(p,(UInt32)uVar4,inStream,baseOffset + local_70,
                                    ((CBuf *)(psVar6 + -1))->data,*psVar6,allocTemp);
          uVar4 = uVar4 + 1;
          psVar6 = psVar6 + 2;
          if (SVar1 != 0) {
            return SVar1;
          }
        }
        return SVar1;
      }
      iVar3 = Buf_Create(pCVar5,p->CoderUnpackSizes
                                [(uint)p->FoToMainUnpackSizeIndex[uVar4] +
                                 p->FoToCoderUnpackSizes[uVar4]],allocTemp);
      uVar4 = uVar4 + 1;
      pCVar5 = pCVar5 + 1;
    } while (iVar3 != 0);
    return 2;
  }
  return 0x10;
}

Assistant:

static SRes SzReadAndDecodePackedStreams(
    ILookInStream *inStream,
    CSzData *sd,
    CBuf *tempBufs,
    UInt32 numFoldersMax,
    UInt64 baseOffset,
    CSzAr *p,
    ISzAlloc *allocTemp)
{
  UInt64 dataStartPos;
  UInt32 fo;
  CSubStreamInfo ssi;

  RINOK(SzReadStreamsInfo(p, sd, numFoldersMax, NULL, 0, &dataStartPos, &ssi, allocTemp));
  
  dataStartPos += baseOffset;
  if (p->NumFolders == 0)
    return SZ_ERROR_ARCHIVE;
 
  for (fo = 0; fo < p->NumFolders; fo++)
    Buf_Init(tempBufs + fo);
  
  for (fo = 0; fo < p->NumFolders; fo++)
  {
    CBuf *tempBuf = tempBufs + fo;
    UInt64 unpackSize = SzAr_GetFolderUnpackSize(p, fo);
    if ((size_t)unpackSize != unpackSize)
      return SZ_ERROR_MEM;
    if (!Buf_Create(tempBuf, (size_t)unpackSize, allocTemp))
      return SZ_ERROR_MEM;
  }
  
  for (fo = 0; fo < p->NumFolders; fo++)
  {
    const CBuf *tempBuf = tempBufs + fo;
    RINOK(LookInStream_SeekTo(inStream, dataStartPos));
    RINOK(SzAr_DecodeFolder(p, fo, inStream, dataStartPos, tempBuf->data, tempBuf->size, allocTemp));
  }
  
  return SZ_OK;
}